

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

LYS_INFORMAT get_schema_format(char *path)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  
  pcVar2 = strrchr(path,0x2e);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "Input file \"%s\" without extension - unknown format.\n";
    __stream = _stdout;
  }
  else {
    path = pcVar2 + 1;
    iVar1 = strcmp(path,"yin");
    if (iVar1 == 0) {
      return LYS_IN_YIN;
    }
    iVar1 = strcmp(path,"yang");
    if (iVar1 == 0) {
      return LYS_IN_YANG;
    }
    pcVar2 = "Input file in an unknown format \"%s\".\n";
    __stream = _stderr;
  }
  fprintf(__stream,pcVar2,path);
  return LYS_IN_UNKNOWN;
}

Assistant:

LYS_INFORMAT
get_schema_format(const char *path)
{
    char *ptr;

    if ((ptr = strrchr(path, '.')) != NULL) {
        ++ptr;
        if (!strcmp(ptr, "yin")) {
            return LYS_IN_YIN;
        } else if (!strcmp(ptr, "yang")) {
            return LYS_IN_YANG;
        } else {
            fprintf(stderr, "Input file in an unknown format \"%s\".\n", ptr);
            return LYS_IN_UNKNOWN;
        }
    } else {
        fprintf(stdout, "Input file \"%s\" without extension - unknown format.\n", path);
        return LYS_IN_UNKNOWN;
    }
}